

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertialParametersSolidShapesHelpers.cpp
# Opt level: O2

bool iDynTree::computeBoundingBoxFromShape(SolidShape *geom,Box *box)

{
  char cVar1;
  Box *pBVar2;
  double dVar3;
  
  cVar1 = iDynTree::SolidShape::isBox();
  if (cVar1 == '\0') {
    cVar1 = iDynTree::SolidShape::isSphere();
    if (cVar1 == '\0') {
      cVar1 = iDynTree::SolidShape::isCylinder();
      if (cVar1 == '\0') {
        iDynTree::reportError
                  ("","computeBoundingBoxFromShape",
                   "IDYNTREE_USES_ASSIMP CMake option need to be set to ON to use computeBoundingBoxFromShape"
                  );
        return false;
      }
      iDynTree::SolidShape::asCylinder();
      dVar3 = (double)iDynTree::Cylinder::getRadius();
      iDynTree::Box::setX(dVar3 + dVar3);
      dVar3 = (double)iDynTree::Cylinder::getRadius();
      iDynTree::Box::setY(dVar3 + dVar3);
      dVar3 = (double)iDynTree::Cylinder::getLength();
    }
    else {
      iDynTree::SolidShape::asSphere();
      dVar3 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setX(dVar3 + dVar3);
      dVar3 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setY(dVar3 + dVar3);
      dVar3 = (double)iDynTree::Sphere::getRadius();
      dVar3 = dVar3 + dVar3;
    }
    iDynTree::Box::setZ(dVar3);
  }
  else {
    pBVar2 = (Box *)iDynTree::SolidShape::asBox();
    Box::operator=(box,pBVar2);
  }
  iDynTree::SolidShape::getLink_H_geometry();
  iDynTree::SolidShape::setLink_H_geometry((Transform *)box);
  return true;
}

Assistant:

bool computeBoundingBoxFromShape(const SolidShape& geom, Box& box)
{
    // Extract BB from shape, this would be benefic from being moved as a method in the SolidShape interface
    if (geom.isBox())
    {
        // If shape is a box, just copy it
        Box* pBox = const_cast<Box*>(geom.asBox());
        box = *pBox;
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }

    if (geom.isSphere())
    {
        // If shape is a sphere all the side of the BB are the diameter of the sphere
        Sphere* pSphere = const_cast<Sphere *>(geom.asSphere());
        box.setX(2.0*pSphere->getRadius());
        box.setY(2.0*pSphere->getRadius());
        box.setZ(2.0*pSphere->getRadius());
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }

    if (geom.isCylinder())
    {
        // If shape is a cylinder the x and y side of the BB are the diameter of the cylinder,
        // while the z side is the lenght of the cylinder
        Cylinder* pCylinder = const_cast<Cylinder *>(geom.asCylinder());
        box.setX(2.0*pCylinder->getRadius());
        box.setY(2.0*pCylinder->getRadius());
        box.setZ(pCylinder->getLength());
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }
    
#ifdef IDYNTREE_USES_ASSIMP
    if (geom.isExternalMesh())
    {
        // If shape is an external mesh, we need to load the mesh and extract the BB
        ExternalMesh* pExtMesh = const_cast<ExternalMesh *>(geom.asExternalMesh());
        return BBFromExternalShape(pExtMesh, box);
    }    
#else
    reportError("", "computeBoundingBoxFromShape", "IDYNTREE_USES_ASSIMP CMake option need to be set to ON to use computeBoundingBoxFromShape");
#endif
    return false;
    
}